

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NodeSplitLarge(Abc_Obj_t *pNode)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pObj_00;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int local_34;
  int nCubes;
  int i;
  int nVars;
  int CutPoint;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjFaninNum(pNode);
  iVar2 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
  pObj = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  pObj_00 = Abc_NtkDupObj(pNode->pNtk,pNode,0);
  for (local_34 = 0; iVar3 = Abc_ObjFaninNum(pNode), local_34 < iVar3; local_34 = local_34 + 1) {
    pAVar4 = Abc_ObjFanin(pNode,local_34);
    Abc_ObjAddFanin(pObj,pAVar4);
  }
  for (local_34 = 0; iVar3 = Abc_ObjFaninNum(pNode), local_34 < iVar3; local_34 = local_34 + 1) {
    pAVar4 = Abc_ObjFanin(pNode,local_34);
    Abc_ObjAddFanin(pObj_00,pAVar4);
  }
  Abc_ObjRemoveFanins(pNode);
  Abc_ObjAddFanin(pNode,pObj);
  Abc_ObjAddFanin(pNode,pObj_00);
  pcVar5 = Abc_SopCreateOr((Mem_Flex_t *)pNode->pNtk->pManFunc,2,(int *)0x0);
  (pNode->field_5).pData = pcVar5;
  if (iVar2 < 2) {
    __assert_fail("nCubes > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFanOrder.c"
                  ,0x19e,"void Abc_NodeSplitLarge(Abc_Obj_t *)");
  }
  iVar1 = (iVar2 / 2) * (iVar1 + 3);
  *(undefined1 *)((long)(pObj->field_5).pData + (long)iVar1) = 0;
  (pObj_00->field_5).pData = (void *)((long)(pObj_00->field_5).pData + (long)iVar1);
  return;
}

Assistant:

void Abc_NodeSplitLarge( Abc_Obj_t * pNode )
{
    Abc_Obj_t * pNode1, * pNode2, * pFanin;
    int CutPoint, nVars = Abc_ObjFaninNum(pNode);
    int i, nCubes = Abc_SopGetCubeNum((char *)pNode->pData);
    pNode1 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    pNode2 = Abc_NtkDupObj( pNode->pNtk, pNode, 0 );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode1, pFanin );
    Abc_ObjForEachFanin( pNode, pFanin, i )
        Abc_ObjAddFanin( pNode2, pFanin );    
    // update the node
    Abc_ObjRemoveFanins( pNode );
    Abc_ObjAddFanin( pNode, pNode1 );
    Abc_ObjAddFanin( pNode, pNode2 );
    pNode->pData = Abc_SopCreateOr( (Mem_Flex_t *)pNode->pNtk->pManFunc, 2, NULL );
    // update covers of the nodes
    assert( nCubes > 1 );
    CutPoint = (nCubes / 2) * (nVars + 3);
    ((char *)pNode1->pData)[CutPoint] = 0;
    pNode2->pData = (char *)pNode2->pData + CutPoint;
}